

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckLabel(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  int iVar2;
  AttVal *av_00;
  AttVal *av;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level2_Enabled(doc);
  if (BVar1 != no) {
    av_00 = prvTidyAttrGetById(node,TidyAttr_FOR);
    BVar1 = hasValue(av_00);
    if (BVar1 != no) {
      (doc->access).HasValidFor = yes;
    }
    iVar2 = (doc->access).ForID + 1;
    (doc->access).ForID = iVar2;
    if (iVar2 == 2) {
      (doc->access).ForID = 0;
      CheckFormControls(doc,node);
    }
  }
  return;
}

Assistant:

static void CheckLabel( TidyDocImpl* doc, Node* node )
{
    if (Level2_Enabled( doc ))
    {    
        /* Checks for valid 'FOR' attribute */
        AttVal* av = attrGetFOR( node );
        if ( hasValue(av) )
            doc->access.HasValidFor = yes;

        if ( ++doc->access.ForID == 2 )
        {
            doc->access.ForID = 0;
            CheckFormControls( doc, node );
        }
    }
}